

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

void redirect_duplicated_labels
               (MIR_context_t ctx,VARR_MIR_insn_t *labels,VARR_MIR_insn_t *branch_insns)

{
  size_t sVar1;
  MIR_insn_t_conflict pMVar2;
  bool bVar3;
  ulong local_40;
  size_t n;
  size_t bound_label_nop;
  size_t start_label_nop;
  MIR_insn_t_conflict insn;
  VARR_MIR_insn_t *branch_insns_local;
  VARR_MIR_insn_t *labels_local;
  MIR_context_t ctx_local;
  
  while (sVar1 = VARR_MIR_insn_tlength(branch_insns), sVar1 != 0) {
    n = 1;
    pMVar2 = VARR_MIR_insn_tpop(branch_insns);
    if ((int)*(undefined8 *)&pMVar2->field_0x18 != 0xa6) {
      if ((int)*(undefined8 *)&pMVar2->field_0x18 == 0xaa) {
        bound_label_nop = 1;
        n = *(ulong *)&pMVar2->field_0x18 >> 0x20;
      }
      else {
        bVar3 = (int)*(undefined8 *)&pMVar2->field_0x18 == 0xa5;
        if (bVar3) {
          n = 2;
        }
        bound_label_nop = (size_t)bVar3;
      }
      for (local_40 = bound_label_nop; local_40 < n; local_40 = local_40 + 1) {
        pMVar2->ops[local_40].u.i = (int64_t)(pMVar2->ops[local_40].u.ref)->data;
      }
    }
  }
  while (sVar1 = VARR_MIR_insn_tlength(labels), sVar1 != 0) {
    pMVar2 = VARR_MIR_insn_tpop(labels);
    pMVar2->data = (void *)0x0;
  }
  return;
}

Assistant:

static void redirect_duplicated_labels (MIR_context_t ctx MIR_UNUSED, VARR (MIR_insn_t) * labels,
                                        VARR (MIR_insn_t) * branch_insns) {
  MIR_insn_t insn;

  while (VARR_LENGTH (MIR_insn_t, branch_insns) != 0) { /* redirect new label operands */
    size_t start_label_nop = 0, bound_label_nop = 1, n;

    insn = VARR_POP (MIR_insn_t, branch_insns);
    if (insn->code == MIR_JMPI) continue;
    if (insn->code == MIR_SWITCH) {
      start_label_nop = 1;
      bound_label_nop = start_label_nop + insn->nops - 1;
    } else if (insn->code == MIR_LADDR) {
      start_label_nop = 1;
      bound_label_nop = 2;
    }
    for (n = start_label_nop; n < bound_label_nop; n++)
      insn->ops[n].u.label = insn->ops[n].u.label->data;
  }
  while (VARR_LENGTH (MIR_insn_t, labels) != 0) { /* reset data */
    insn = VARR_POP (MIR_insn_t, labels);
    insn->data = NULL;
  }
}